

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.hpp
# Opt level: O2

void __thiscall schema::ColumnBase::~ColumnBase(ColumnBase *this)

{
  this->_vptr_ColumnBase = (_func_int **)&PTR__ColumnBase_00202078;
  std::__cxx11::string::~string((string *)&this->binding);
  std::__cxx11::string::~string((string *)&this->bName);
  std::__cxx11::string::~string((string *)&this->sqlType);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~ColumnBase() = default;